

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_ignore_zeros.c
# Opt level: O3

void test_option_ignore_zeros_mode_x(void)

{
  int iVar1;
  wchar_t wVar2;
  
  iVar1 = make_files();
  if (iVar1 != 0) {
    return;
  }
  wVar2 = systemf("%s xf ab-cat.tar --ignore-zeros -C out > test.out 2> test.err",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_ignore_zeros.c"
                      ,L'?',0,"0",(long)wVar2,
                      "systemf( \"%s xf ab-cat.tar --ignore-zeros -C out > test.out 2> test.err\", testprog)"
                      ,(void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_ignore_zeros.c"
             ,L'@',"test.err");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_ignore_zeros.c"
             ,L'A',"test.out");
  assertion_equal_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_ignore_zeros.c"
             ,L'C',"out/a","in/a");
  assertion_equal_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_ignore_zeros.c"
             ,L'D',"out/b","in/b");
  return;
}

Assistant:

DEFINE_TEST(test_option_ignore_zeros_mode_x)
{
	if (make_files())
		return;

	assertEqualInt(0, systemf(
	    "%s xf ab-cat.tar --ignore-zeros -C out > test.out 2> test.err",
	    testprog));
	assertEmptyFile("test.err");
	assertEmptyFile("test.out");

	assertEqualFile("out/a", "in/a");
	assertEqualFile("out/b", "in/b");
}